

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_InitialConfigure
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,int primeBuffers,
                  snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  char *pcVar4;
  bool local_8a;
  bool local_89;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int err;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  uint minPeriods;
  double sr;
  snd_pcm_t *pcm;
  int dir;
  snd_pcm_access_t alternateAccessMode;
  snd_pcm_access_t accessMode;
  PaError result;
  double *sampleRate_local;
  snd_pcm_hw_params_t *hwParams_local;
  PaStreamParameters *pPStack_18;
  int primeBuffers_local;
  PaStreamParameters *params_local;
  PaAlsaStreamComponent *self_local;
  
  alternateAccessMode = SND_PCM_ACCESS_MMAP_INTERLEAVED;
  pcm._0_4_ = 0;
  sr = (double)self->pcm;
  ___pa_unsure_error_id = *sampleRate;
  __pa_unsure_error_id_1 = 2;
  _accessMode = sampleRate;
  sampleRate_local = (double *)hwParams;
  hwParams_local._4_4_ = primeBuffers;
  pPStack_18 = params;
  params_local = (PaStreamParameters *)self;
  iVar1 = (*(code *)alsa_snd_pcm_hw_params_any)(sr,hwParams);
  if (iVar1 < 0) {
    pVar3 = pthread_self();
    iVar2 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar4 = (*alsa_snd_strerror)(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1974\n"
                     );
    alternateAccessMode = 0xffffd8f1;
  }
  else {
    iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_periods_integer)(sr,sampleRate_local);
    if (iVar1 < 0) {
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar4 = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1976\n"
                       );
      alternateAccessMode = 0xffffd8f1;
    }
    else {
      pcm._0_4_ = 0;
      iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_periods_min)
                        (sr,sampleRate_local,&__pa_unsure_error_id_1,&pcm);
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar4 = (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1979\n"
                         );
        alternateAccessMode = 0xffffd8f1;
      }
      else {
        if (*(int *)&params_local->suggestedLatency == 0) {
          dir = 1;
          pcm._4_4_ = 0;
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(sr,sampleRate_local,1);
          local_8a = true;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(sr,sampleRate_local,pcm._4_4_);
            local_8a = -1 < iVar1;
          }
          *(uint *)&params_local->hostApiSpecificStreamInfo = (uint)local_8a;
          if (*(int *)&params_local->hostApiSpecificStreamInfo == 0) {
            dir = 4;
            pcm._4_4_ = 3;
          }
        }
        else {
          dir = 0;
          pcm._4_4_ = 1;
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(sr,sampleRate_local,0);
          local_89 = true;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(sr,sampleRate_local,pcm._4_4_);
            local_89 = -1 < iVar1;
          }
          *(uint *)&params_local->hostApiSpecificStreamInfo = (uint)local_89;
          if (*(int *)&params_local->hostApiSpecificStreamInfo == 0) {
            dir = 3;
            pcm._4_4_ = 4;
          }
        }
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_access)(sr,sampleRate_local,dir);
        if (iVar1 < 0) {
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_access)(sr,sampleRate_local,pcm._4_4_);
          if (iVar1 < 0) {
            alternateAccessMode = 0xffffd8f1;
            pcVar4 = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
            return alternateAccessMode;
          }
          *(uint *)((long)&params_local->suggestedLatency + 4) =
               (uint)((*(int *)&params_local->suggestedLatency != 0 ^ 0xffU) & 1);
        }
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_format)
                          (sr,sampleRate_local,*(undefined4 *)&params_local[2].suggestedLatency);
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar4 = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2035\n"
                           );
          alternateAccessMode = 0xffffd8f1;
        }
        else {
          alternateAccessMode =
               SetApproximateSampleRate
                         ((snd_pcm_t *)sr,(snd_pcm_hw_params_t *)sampleRate_local,
                          ___pa_unsure_error_id);
          if (alternateAccessMode == 0xffffd8f1) {
            paUtilErr_ = -9999;
            PaUtil_DebugPrint(
                             "Expression \'paUnanticipatedHostError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2048\n"
                             );
            alternateAccessMode = paUtilErr_;
          }
          else {
            iVar1 = GetExactSampleRate((snd_pcm_hw_params_t *)sampleRate_local,
                                       (double *)&__pa_unsure_error_id);
            if (iVar1 < 0) {
              pVar3 = pthread_self();
              iVar2 = pthread_equal(pVar3,paUnixMainThread);
              if (iVar2 != 0) {
                pcVar4 = (*alsa_snd_strerror)(iVar1);
                PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
              }
              PaUtil_DebugPrint(
                               "Expression \'GetExactSampleRate( hwParams, &sr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2039\n"
                               );
              alternateAccessMode = 0xffffd8f1;
            }
            else if (alternateAccessMode == 0xffffd8f3) {
              paUtilErr_ = -0x270d;
              PaUtil_DebugPrint(
                               "Expression \'paInvalidSampleRate\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2043\n"
                               );
              alternateAccessMode = paUtilErr_;
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_channels)
                                (sr,sampleRate_local,
                                 *(undefined4 *)((long)&params_local->sampleFormat + 4));
              if (iVar1 < 0) {
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2051\n"
                                 );
                alternateAccessMode = 0xffffd8f2;
              }
              else {
                *_accessMode = ___pa_unsure_error_id;
              }
            }
          }
        }
      }
    }
  }
  return alternateAccessMode;
}

Assistant:

static PaError PaAlsaStreamComponent_InitialConfigure( PaAlsaStreamComponent *self, const PaStreamParameters *params,
        int primeBuffers, snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    /* Configuration consists of setting all of ALSA's parameters.
     * These parameters come in two flavors: hardware parameters
     * and software paramters.  Hardware parameters will affect
     * the way the device is initialized, software parameters
     * affect the way ALSA interacts with me, the user-level client.
     */

    PaError result = paNoError;
    snd_pcm_access_t accessMode, alternateAccessMode;
    int dir = 0;
    snd_pcm_t *pcm = self->pcm;
    double sr = *sampleRate;
    unsigned int minPeriods = 2;

    /* self->framesPerPeriod = framesPerHostBuffer; */

    /* ... fill up the configuration space with all possibile
     * combinations of parameters this device will accept */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams ), paUnanticipatedHostError );
    /* I think there should be at least 2 periods (even though ALSA doesn't appear to enforce this) */
    dir = 0;
    ENSURE_( alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir ), paUnanticipatedHostError );

    if( self->userInterleaved )
    {
        accessMode          = SND_PCM_ACCESS_MMAP_INTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_INTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_NONINTERLEAVED;
        }
    }
    else
    {
        accessMode          = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_INTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG((" %s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_NONINTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_INTERLEAVED;
        }
    }

    PA_DEBUG(( "%s: device can MMAP: %s\n", __FUNCTION__, ( self->canMmap ? "YES" : "NO" ) ));

    /* If requested access mode fails, try alternate mode */
    if( alsa_snd_pcm_hw_params_set_access( pcm, hwParams, accessMode ) < 0 )
    {
        int err = 0;
        if( ( err = alsa_snd_pcm_hw_params_set_access( pcm, hwParams, alternateAccessMode )) < 0 )
        {
            result = paUnanticipatedHostError;
            PaUtil_SetLastHostErrorInfo( paALSA, err, alsa_snd_strerror( err ) );
            goto error;
        }
        /* Flip mode */
        self->hostInterleaved = !self->userInterleaved;
    }

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat ), paUnanticipatedHostError );

    if( ( result = SetApproximateSampleRate( pcm, hwParams, sr )) != paUnanticipatedHostError )
    {
        ENSURE_( GetExactSampleRate( hwParams, &sr ), paUnanticipatedHostError );
        if( result == paInvalidSampleRate ) /* From the SetApproximateSampleRate() call above */
        { /* The sample rate was returned as 'out of tolerance' of the one requested */
            PA_DEBUG(( "%s: Wanted %.3f, closest sample rate was %.3f\n", __FUNCTION__, sampleRate, sr ));
            PA_ENSURE( paInvalidSampleRate );
        }
    }
    else
    {
       PA_ENSURE( paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels ), paInvalidChannelCount );

    *sampleRate = sr;

end:
    return result;

error:
    /* No particular action */
    goto end;
}